

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O2

string * __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_char,unsigned_char>::
getFragmentShaderCode_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  int iVar1;
  ostream *poVar2;
  TestError *this_00;
  string outType;
  string samplerType;
  string coordType;
  string outCommand;
  stringstream result;
  ostream local_188;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result);
  coordType._M_dataplus._M_p = (pointer)&coordType.field_2;
  coordType._M_string_length = 0;
  samplerType._M_dataplus._M_p = (pointer)&samplerType.field_2;
  samplerType._M_string_length = 0;
  coordType.field_2._M_local_buf[0] = '\0';
  samplerType.field_2._M_local_buf[0] = '\0';
  outType._M_dataplus._M_p = (pointer)&outType.field_2;
  outType._M_string_length = 0;
  outCommand._M_dataplus._M_p = (pointer)&outCommand.field_2;
  outCommand._M_string_length = 0;
  outType.field_2._M_local_buf[0] = '\0';
  outCommand.field_2._M_local_buf[0] = '\0';
  iVar1 = *(int *)((long)this + 0x2dc);
  if ((((iVar1 != 0x8058) && (iVar1 != 0x81a5)) && (iVar1 != 0x8235)) &&
     (((iVar1 != 0x8236 && (iVar1 != 0x8814)) && ((iVar1 != 0x9278 && (iVar1 != 0x8cac)))))) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Not allowed internal format",fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
               ,0x318);
LAB_00cc3570:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::assign((char *)&samplerType);
  iVar1 = *(int *)((long)this + 0x2d8);
  if (iVar1 == 0x8c1a) {
    std::__cxx11::string::assign((char *)&coordType);
  }
  else if (iVar1 == 0x806f) {
    std::__cxx11::string::assign((char *)&coordType);
  }
  else {
    if (iVar1 != 0xde1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not allowed texture target!",fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x32e);
      goto LAB_00cc3570;
    }
    std::__cxx11::string::assign((char *)&coordType);
  }
  std::__cxx11::string::append((char *)&samplerType);
  iVar1 = *(int *)((long)this + 0x2e0);
  if (iVar1 == 0x8236) {
    std::__cxx11::string::assign((char *)&outType);
  }
  else if (iVar1 == 0x8229) {
    std::__cxx11::string::assign((char *)&outType);
  }
  else if (iVar1 == 0x8235) {
    std::__cxx11::string::assign((char *)&outType);
  }
  else {
    if (iVar1 != 0x8058) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not allowed internal format!",fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x349);
      goto LAB_00cc3570;
    }
    std::__cxx11::string::assign((char *)&outType);
  }
  std::__cxx11::string::assign((char *)&outCommand);
  poVar2 = std::operator<<(&local_188,"${VERSION}\n\nprecision highp float;\nprecision highp ");
  poVar2 = std::operator<<(poVar2,(string *)&samplerType);
  poVar2 = std::operator<<(poVar2,";\n\nuniform ");
  poVar2 = std::operator<<(poVar2,(string *)&samplerType);
  poVar2 = std::operator<<(poVar2," test_sampler;\nin  ");
  poVar2 = std::operator<<(poVar2,(string *)&coordType);
  poVar2 = std::operator<<(poVar2," texture_coords_out;\nlayout(location = 0) out ");
  poVar2 = std::operator<<(poVar2,(string *)&outType);
  poVar2 = std::operator<<(poVar2," color;\n\nvoid main()\n{\n   color = ");
  poVar2 = std::operator<<(poVar2,(string *)&outCommand);
  std::operator<<(poVar2,";\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&outCommand);
  std::__cxx11::string::~string((string *)&outType);
  std::__cxx11::string::~string((string *)&samplerType);
  std::__cxx11::string::~string((string *)&coordType);
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBorderClampSamplingTexture<InputType, OutputType>::getFragmentShaderCode(void)
{
	std::stringstream result;
	std::string		  coordType;
	std::string		  samplerType;
	std::string		  outType;
	std::string		  outCommand;

	/* Check input texture format and prepare sampler prefix */
	switch (m_test_configuration.get_input_internal_format())
	{
	case GL_RGBA32F:
	case GL_RGBA8:
	case GL_DEPTH_COMPONENT32F:
	case GL_DEPTH_COMPONENT16:
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
		samplerType = "";
		break;

	case GL_R32UI:
		samplerType = "u";
		break;

	case GL_R32I:
		samplerType = "i";
		break;

	default:
		throw tcu::TestError("Not allowed internal format", "", __FILE__, __LINE__);
	}

	/* Check input texture target and prepare approperiate texture coordinate type and sampler type */
	switch (m_test_configuration.get_target())
	{
	case GL_TEXTURE_2D:
		coordType = "vec2";
		samplerType += "sampler2D";
		break;

	case GL_TEXTURE_2D_ARRAY:
		coordType = "vec3";
		samplerType += "sampler2DArray";
		break;

	case GL_TEXTURE_3D:
		coordType = "vec3";
		samplerType += "sampler3D";
		break;

	default:
		throw tcu::TestError("Not allowed texture target!", "", __FILE__, __LINE__);
	}

	/* Check output texture format and prepare approperiate texel fetching method and output type */
	switch (m_test_configuration.get_output_internal_format())
	{
	case GL_RGBA8:
		outType	= "vec4";
		outCommand = "texture(test_sampler, texture_coords_out)";
		break;

	case GL_R8:
		outType	= "float";
		outCommand = "texture(test_sampler, texture_coords_out).x";
		break;

	case GL_R32UI:
		outType	= "uint";
		outCommand = "uint(texture(test_sampler, texture_coords_out).x)";
		break;

	case GL_R32I:
		outType	= "int";
		outCommand = "int(texture(test_sampler, texture_coords_out).x)";
		break;

	default:
		throw tcu::TestError("Not allowed internal format!", "", __FILE__, __LINE__);
	}

	result << "${VERSION}\n"
			  "\n"
			  "precision highp float;\n"
			  "precision highp "
		   << samplerType << ";\n"
							 "\n"
							 "uniform "
		   << samplerType << " test_sampler;\n"
							 "in  "
		   << coordType << " texture_coords_out;\n"
						   "layout(location = 0) out "
		   << outType << " color;\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "   color = "
		   << outCommand << ";\n"
							"}\n";

	return result.str();
}